

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

llb_buildsystem_command_t *
anon_unknown.dwarf_868a::depinfo_tester_tool_create_command(void *context,llb_data_t *name)

{
  llb_buildsystem_command_t *plVar1;
  long lVar2;
  code **ppcVar3;
  undefined8 *puVar4;
  llb_buildsystem_external_command_delegate_t in_stack_ffffffffffffff38;
  code *local_68 [4];
  code *local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_68[0] = (code *)0x0;
  local_68[1] = (code *)0x0;
  local_68[2] = (code *)0x0;
  local_68[3] = depinfo_tester_command_start;
  local_48 = depinfo_tester_command_provide_value;
  local_40 = depinfo_tester_command_execute_command;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  uStack_10 = 0;
  ppcVar3 = local_68;
  puVar4 = (undefined8 *)&stack0xffffffffffffff38;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *ppcVar3;
    ppcVar3 = ppcVar3 + 1;
    puVar4 = puVar4 + 1;
  }
  plVar1 = llb_buildsystem_external_command_create(name,in_stack_ffffffffffffff38);
  return plVar1;
}

Assistant:

static llb_buildsystem_command_t*
depinfo_tester_tool_create_command(void *context, const llb_data_t* name) {
  llb_buildsystem_external_command_delegate_t delegate;
  delegate.context = NULL;
  delegate.destroy_context = NULL;
  delegate.get_signature = NULL;
  delegate.configure = NULL;
  delegate.start = depinfo_tester_command_start;
  delegate.provide_value = depinfo_tester_command_provide_value;
  delegate.execute_command = depinfo_tester_command_execute_command;
  delegate.execute_command_ex = NULL;
  delegate.execute_command_detached = NULL;
  delegate.cancel_detached_command = NULL;
  delegate.is_result_valid = NULL;
  delegate.is_result_valid_with_fallback = NULL;
  return llb_buildsystem_external_command_create(name, delegate);
}